

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_string.hpp
# Opt level: O2

string * iutest::detail::StripTrailingSpace(string *__return_storage_ptr__,string *str)

{
  pointer pcVar1;
  size_type sVar2;
  pointer pcVar3;
  
  pcVar1 = (str->_M_dataplus)._M_p;
  sVar2 = str->_M_string_length;
  pcVar3 = pcVar1 + 1;
  do {
    if (sVar2 == 1) {
LAB_00165913:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)__return_storage_ptr__,pcVar1,pcVar3);
      return __return_storage_ptr__;
    }
    if ((pcVar1[sVar2 - 1] != ' ') && (pcVar1[sVar2 - 1] != '\t')) {
      pcVar3 = pcVar1 + sVar2;
      goto LAB_00165913;
    }
    sVar2 = sVar2 - 1;
  } while( true );
}

Assistant:

inline ::std::string StripTrailingSpace(const ::std::string& str)
{
    ::std::string::const_iterator it = str.end()-1;
    while(it != str.begin() && IsSpace(*it))
    {
        --it;
    }
    return ::std::string(str.begin(), it+1);
}